

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_allocator.h
# Opt level: O0

uint8_t * flatbuffers::ReallocateDownward
                    (Allocator *allocator,uint8_t *old_p,size_t old_size,size_t new_size,
                    size_t in_use_back,size_t in_use_front)

{
  int iVar1;
  undefined4 extraout_var;
  Allocator *local_68;
  Allocator local_48;
  size_t local_40;
  size_t in_use_front_local;
  size_t in_use_back_local;
  size_t new_size_local;
  size_t old_size_local;
  uint8_t *old_p_local;
  Allocator *allocator_local;
  
  local_40 = in_use_front;
  in_use_front_local = in_use_back;
  in_use_back_local = new_size;
  new_size_local = old_size;
  old_size_local = (size_t)old_p;
  old_p_local = (uint8_t *)allocator;
  if (allocator == (Allocator *)0x0) {
    local_48._vptr_Allocator = (_func_int **)0x0;
    DefaultAllocator::DefaultAllocator((DefaultAllocator *)&local_48);
    local_68 = (Allocator *)
               Allocator::reallocate_downward
                         (&local_48,(uint8_t *)old_size_local,new_size_local,in_use_back_local,
                          in_use_front_local,local_40);
  }
  else {
    iVar1 = (*allocator->_vptr_Allocator[4])
                      (allocator,old_p,old_size,new_size,in_use_back,in_use_front);
    local_68 = (Allocator *)CONCAT44(extraout_var,iVar1);
  }
  allocator_local = local_68;
  if (allocator == (Allocator *)0x0) {
    DefaultAllocator::~DefaultAllocator((DefaultAllocator *)&local_48);
  }
  return (uint8_t *)allocator_local;
}

Assistant:

inline uint8_t *ReallocateDownward(Allocator *allocator, uint8_t *old_p,
                                   size_t old_size, size_t new_size,
                                   size_t in_use_back, size_t in_use_front) {
  return allocator ? allocator->reallocate_downward(old_p, old_size, new_size,
                                                    in_use_back, in_use_front)
                   : DefaultAllocator().reallocate_downward(
                         old_p, old_size, new_size, in_use_back, in_use_front);
}